

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

nn_trie_node * nn_node_compact(nn_trie_node *self)

{
  nn_trie_node *pnVar1;
  int iVar2;
  nn_trie_node **ppnVar3;
  nn_trie_node *in_RDI;
  nn_trie_node *ch;
  nn_trie_node *local_8;
  
  iVar2 = nn_node_has_subscribers(in_RDI);
  local_8 = in_RDI;
  if ((iVar2 == 0) && (in_RDI->type == '\x01')) {
    ppnVar3 = nn_node_child(in_RDI,0);
    pnVar1 = *ppnVar3;
    if ((uint)in_RDI->prefix_len + (uint)pnVar1->prefix_len + 1 < 0xb) {
      memmove(pnVar1->prefix + (long)(int)(uint)in_RDI->prefix_len + 1,pnVar1->prefix,
              (ulong)pnVar1->prefix_len);
      memcpy(pnVar1->prefix,in_RDI->prefix,(ulong)in_RDI->prefix_len);
      pnVar1->prefix[in_RDI->prefix_len] = (in_RDI->u).sparse.children[0];
      pnVar1->prefix_len = pnVar1->prefix_len + in_RDI->prefix_len + '\x01';
      nn_free((void *)0x30171f);
      local_8 = pnVar1;
    }
  }
  return local_8;
}

Assistant:

struct nn_trie_node *nn_node_compact (struct nn_trie_node *self)
{
    /*  Tries to merge the node with the child node. Returns pointer to
        the compacted node. */

    struct nn_trie_node *ch;

    /*  Node that is a subscription cannot be compacted. */
    if (nn_node_has_subscribers (self))
        return self;

    /*  Only a node with a single child can be compacted. */
    if (self->type != 1)
        return self;

    /*  Check whether combined prefixes would fix into a single node. */
    ch = *nn_node_child (self, 0);
    if (self->prefix_len + ch->prefix_len + 1 > NN_TRIE_PREFIX_MAX)
        return self;

    /*  Concatenate the prefixes. */
    memmove (ch->prefix + self->prefix_len + 1, ch->prefix, ch->prefix_len);
    memcpy (ch->prefix, self->prefix, self->prefix_len);
    ch->prefix [self->prefix_len] = self->u.sparse.children [0];
    ch->prefix_len += self->prefix_len + 1;

    /*  Get rid of the obsolete parent node. */
    nn_free (self);

    /*  Return the new compacted node. */
    return ch;
}